

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Bit_t * Acec_MapMajOuts(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  uint uVar1;
  Vec_Bit_t *pVVar2;
  int *__s;
  int iVar3;
  size_t __size;
  int iVar4;
  int iVar5;
  
  iVar5 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  iVar3 = iVar5 * 0x20;
  pVVar2->nCap = iVar3;
  if (iVar5 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar5 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar3;
  iVar4 = 0;
  memset(__s,0,__size);
  iVar5 = vAdds->nSize;
  if (0 < iVar5) {
    do {
      if (iVar5 <= (int)(iVar4 + 4U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vAdds->pArray[iVar4 + 4U];
      if (((int)uVar1 < 0) || (iVar3 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      iVar4 = iVar4 + 6;
    } while (iVar4 < iVar5);
  }
  return pVVar2;
}

Assistant:

Vec_Bit_t * Acec_MapMajOuts( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), 1 );
    return vMap;
}